

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

double mpack_expect_double_range(mpack_reader_t *reader,double min_value,double max_value)

{
  double dVar1;
  double dVar2;
  
  dVar1 = mpack_expect_double(reader);
  dVar2 = min_value;
  if ((reader->error == mpack_ok) && ((dVar1 < min_value || (dVar2 = dVar1, max_value < dVar1)))) {
    reader->error = mpack_error_type;
    reader->end = reader->data;
    dVar2 = min_value;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
    }
  }
  return dVar2;
}

Assistant:

double mpack_expect_double_range(mpack_reader_t* reader, double min_value, double max_value) {MPACK_EXPECT_RANGE_IMPL(double, double)}